

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::
     doPrintIVal(FloatFormat *fmt,IVal *ival,ostream *os)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  bVar2 = false;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    Traits<int>::doPrintIVal(fmt,ival->m_data + lVar4,os);
    lVar4 = 1;
    bVar2 = true;
    bVar1 = false;
  } while (bVar3);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}